

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

gflags * __thiscall gflags::DescribeOneFlagInXML_abi_cxx11_(gflags *this,CommandLineFlagInfo *flag)

{
  allocator local_1a;
  undefined1 local_19;
  CommandLineFlagInfo *local_18;
  CommandLineFlagInfo *flag_local;
  string *r;
  
  local_19 = 0;
  local_18 = flag;
  flag_local = (CommandLineFlagInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"<flag>",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  AddXMLTag((string *)this,"file",&local_18->filename);
  AddXMLTag((string *)this,"name",&local_18->name);
  AddXMLTag((string *)this,"meaning",&local_18->description);
  AddXMLTag((string *)this,"default",&local_18->default_value);
  AddXMLTag((string *)this,"current",&local_18->current_value);
  AddXMLTag((string *)this,"type",&local_18->type);
  std::__cxx11::string::operator+=((string *)this,"</flag>");
  return this;
}

Assistant:

static string DescribeOneFlagInXML(const CommandLineFlagInfo& flag) {
  // The file and flagname could have been attributes, but default
  // and meaning need to avoid attribute normalization.  This way it
  // can be parsed by simple programs, in addition to xml parsers.
  string r("<flag>");
  AddXMLTag(&r, "file", flag.filename);
  AddXMLTag(&r, "name", flag.name);
  AddXMLTag(&r, "meaning", flag.description);
  AddXMLTag(&r, "default", flag.default_value);
  AddXMLTag(&r, "current", flag.current_value);
  AddXMLTag(&r, "type", flag.type);
  r += "</flag>";
  return r;
}